

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_no_double_call_once(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  undefined1 local_80 [120];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_80);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(local_80,timer_check_double_call,10,10);
    if (iVar1 != 0) goto LAB_001d78e7;
    uv_sleep(0x14);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 1) goto LAB_001d78f6;
    if (timer_check_double_call_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d7914;
    }
  }
  else {
    run_test_timer_no_double_call_once_cold_1();
LAB_001d78e7:
    run_test_timer_no_double_call_once_cold_2();
LAB_001d78f6:
    run_test_timer_no_double_call_once_cold_3();
  }
  run_test_timer_no_double_call_once_cold_4();
LAB_001d7914:
  run_test_timer_no_double_call_once_cold_5();
  timer_check_double_call_called = timer_check_double_call_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_no_double_call_once) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle,
                           timer_check_double_call,
                           timeout_ms,
                           timeout_ms));
  uv_sleep(timeout_ms * 2);
  ASSERT_EQ(1, uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT_EQ(1, timer_check_double_call_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}